

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# decodeframe.c
# Opt level: O1

void read_coeffs_tx_intra_block
               (AV1_COMMON *cm,DecoderCodingBlock *dcb,aom_reader *r,int plane,int row,int col,
               TX_SIZE tx_size)

{
  od_ec_dec *dec;
  short *psVar1;
  BLOCK_SIZE plane_bsize;
  TX_CLASS tx_class;
  ushort uVar2;
  ushort uVar3;
  ushort uVar4;
  ushort uVar5;
  short sVar6;
  undefined4 uVar7;
  MB_MODE_INFO *pMVar8;
  FRAME_CONTEXT *pFVar9;
  tran_low_t *ptVar10;
  eob_info *peVar11;
  MB_MODE_INFO *pMVar12;
  int16_t *piVar13;
  short sVar14;
  undefined1 auVar15 [13];
  undefined1 auVar16 [13];
  undefined1 auVar17 [13];
  undefined1 auVar18 [13];
  undefined1 auVar19 [13];
  undefined1 auVar20 [13];
  undefined1 auVar21 [13];
  undefined1 auVar22 [13];
  ushort uVar23;
  int iVar24;
  int iVar25;
  int iVar26;
  int iVar27;
  int iVar28;
  int iVar29;
  int iVar30;
  uint *puVar31;
  qm_val_t *pqVar32;
  aom_cdf_prob (*levels) [42] [5];
  byte *pbVar33;
  byte bVar34;
  byte bVar35;
  byte bVar36;
  byte bVar37;
  byte bVar38;
  aom_cdf_prob (*paaVar39) [5];
  byte bVar40;
  int iVar41;
  ulong uVar42;
  aom_cdf_prob *paVar43;
  uint uVar44;
  uint uVar45;
  uint *puVar46;
  char cVar47;
  uint uVar48;
  aom_cdf_prob (*paaVar49) [3];
  long lVar50;
  byte bVar51;
  ulong uVar52;
  long lVar53;
  ulong uVar54;
  long lVar55;
  ulong uVar56;
  uint uVar57;
  ulong uVar58;
  long lVar59;
  int iVar60;
  int iVar61;
  ulong uVar62;
  aom_cdf_prob (*icdf) [6];
  aom_cdf_prob (*icdf_00) [10];
  aom_cdf_prob (*icdf_01) [8];
  aom_cdf_prob (*icdf_02) [9];
  uint16_t *puVar63;
  aom_cdf_prob (*icdf_03) [11];
  uint uVar64;
  bool bVar65;
  bool bVar66;
  undefined1 auVar67 [16];
  undefined1 auVar68 [16];
  undefined1 auVar69 [16];
  undefined1 auVar70 [16];
  undefined1 auVar71 [16];
  br_cdf_arr br_cdf;
  char cStack_659;
  byte abStack_558 [1320];
  
  if ((*(dcb->xd).mi)->skip_txfm != '\0') {
    return;
  }
  pMVar8 = *(dcb->xd).mi;
  puVar46 = (uint *)((dcb->xd).plane[plane].above_entropy_context + col);
  plane_bsize = av1_ss_size_lookup[pMVar8->bsize][(dcb->xd).plane[plane].subsampling_x]
                [(dcb->xd).plane[plane].subsampling_y];
  uVar62 = (ulong)plane_bsize;
  puVar31 = (uint *)((dcb->xd).plane[plane].left_entropy_context + row);
  uVar56 = (ulong)tx_size;
  switch(tx_size) {
  case '\0':
    bVar34 = (byte)*puVar46;
    bVar35 = (byte)*puVar31;
    cStack_659 = get_txb_ctx_general_dc_sign_contexts
                 [(long)*(char *)((long)&get_txb_ctx_general_signs + (ulong)(bVar35 >> 3)) +
                  (long)*(char *)((long)&get_txb_ctx_general_signs + (ulong)(bVar34 >> 3)) + 0x20];
    if (plane != 0) {
      lVar50 = ((ulong)(uVar62 != 0) * 3 + 1) - (ulong)(bVar34 == 0);
      bVar65 = bVar35 == 0;
      goto LAB_0017eac1;
    }
    if (uVar62 == 0) goto LAB_0017ecb5;
LAB_0017ed11:
    uVar44 = (uint)(bVar34 & 7);
    if (3 < (bVar34 & 7)) {
      uVar44 = 4;
    }
    uVar48 = 4;
    if ((bVar35 & 7) < 4) {
      uVar48 = (uint)(bVar35 & 7);
    }
    uVar62 = (ulong)(byte)get_txb_ctx_general_skip_contexts[(ulong)uVar48 + (ulong)uVar44 * 5];
    goto LAB_0017ee77;
  case '\x01':
    lVar50 = 0;
    uVar52 = 0;
    do {
      uVar52 = (ulong)(uint)((int)uVar52 +
                            (int)*(char *)((long)&get_txb_ctx_general_signs +
                                          (ulong)(*(byte *)((long)puVar46 + lVar50) >> 3)));
      lVar50 = lVar50 + 1;
    } while (lVar50 == 1);
    lVar50 = 0;
    do {
      uVar52 = (long)(int)uVar52 +
               (long)*(char *)((long)&get_txb_ctx_general_signs +
                              (ulong)(*(byte *)((long)puVar31 + lVar50) >> 3));
      lVar50 = lVar50 + 1;
    } while (lVar50 == 1);
    cStack_659 = get_txb_ctx_general_dc_sign_contexts[uVar52 + 0x20];
    if (plane == 0) {
      if (plane_bsize != BLOCK_8X8) {
        bVar34 = (byte)((ushort)(short)*puVar46 >> 8) | (byte)(short)*puVar46;
        bVar35 = (byte)((ushort)(short)*puVar31 >> 8) | (byte)(short)*puVar31;
        goto LAB_0017ed11;
      }
LAB_0017ecb5:
      uVar62 = 0;
      goto LAB_0017ee77;
    }
    lVar50 = ((ulong)((0x3cfff0UL >> (uVar62 & 0x3f) & 1) != 0) * 3 + 1) -
             (ulong)((short)*puVar46 == 0);
    bVar65 = (short)*puVar31 == 0;
    goto LAB_0017eac1;
  case '\x02':
    lVar50 = 0;
    uVar52 = 0;
    do {
      uVar52 = (ulong)(uint)((int)uVar52 +
                            (int)*(char *)((long)&get_txb_ctx_general_signs +
                                          (ulong)(*(byte *)((long)puVar46 + lVar50) >> 3)));
      lVar50 = lVar50 + 1;
    } while (lVar50 != 4);
    lVar50 = 0;
    do {
      uVar52 = (long)(int)uVar52 +
               (long)*(char *)((long)&get_txb_ctx_general_signs +
                              (ulong)(*(byte *)((long)puVar31 + lVar50) >> 3));
      lVar50 = lVar50 + 1;
    } while (lVar50 != 4);
    cStack_659 = get_txb_ctx_general_dc_sign_contexts[uVar52 + 0x20];
    if (plane == 0) {
      if (plane_bsize != BLOCK_16X16) {
        uVar44 = *puVar46 >> 0x10 | *puVar46;
        bVar34 = (byte)(uVar44 >> 8) | (byte)uVar44;
        uVar44 = *puVar31 >> 0x10 | *puVar31;
        bVar35 = (byte)(uVar44 >> 8) | (byte)uVar44;
        goto LAB_0017ed11;
      }
      goto LAB_0017ecb5;
    }
    lVar50 = ((ulong)((0x30ff80UL >> (uVar62 & 0x3f) & 1) != 0) * 3 + 1) - (ulong)(*puVar46 == 0);
    bVar65 = *puVar31 == 0;
    goto LAB_0017eac1;
  case '\x03':
    lVar50 = 0;
    uVar52 = 0;
    do {
      uVar52 = (ulong)(uint)((int)uVar52 +
                            (int)*(char *)((long)&get_txb_ctx_general_signs +
                                          (ulong)(*(byte *)((long)puVar46 + lVar50) >> 3)));
      lVar50 = lVar50 + 1;
    } while (lVar50 != 8);
    lVar50 = 0;
    do {
      uVar52 = (long)(int)uVar52 +
               (long)*(char *)((long)&get_txb_ctx_general_signs +
                              (ulong)(*(byte *)((long)puVar31 + lVar50) >> 3));
      lVar50 = lVar50 + 1;
    } while (lVar50 != 8);
    cStack_659 = get_txb_ctx_general_dc_sign_contexts[uVar52 + 0x20];
    if (plane == 0) {
      if (plane_bsize == BLOCK_32X32) goto LAB_0017ecb5;
      lVar50 = 0;
      auVar69 = (undefined1  [16])0x0;
      do {
        uVar7 = *(undefined4 *)((long)puVar46 + lVar50);
        uVar62 = (ulong)(ushort)uVar7 & 0xffffffffffff00ff;
        auVar15._8_4_ = 0;
        auVar15._0_8_ = uVar62;
        auVar15[0xc] = (char)((uint)uVar7 >> 0x18);
        auVar16[8] = (char)((uint)uVar7 >> 0x10);
        auVar16._0_8_ = uVar62;
        auVar16[9] = 0;
        auVar16._10_3_ = auVar15._10_3_;
        auVar21._5_8_ = 0;
        auVar21._0_5_ = auVar16._8_5_;
        auVar70._0_4_ = (undefined4)uVar62;
        auVar17[4] = (char)((uint)uVar7 >> 8);
        auVar17._0_4_ = auVar70._0_4_;
        auVar17[5] = 0;
        auVar17._6_7_ = SUB137(auVar21 << 0x40,6);
        auVar70._4_9_ = auVar17._4_9_;
        auVar70._13_3_ = 0;
        auVar69 = auVar69 | auVar70;
        lVar50 = lVar50 + 4;
      } while (lVar50 != 8);
      auVar67._0_8_ = auVar69._8_8_;
      auVar67._8_4_ = auVar69._8_4_;
      auVar67._12_4_ = auVar69._12_4_;
      lVar50 = 0;
      auVar70 = (undefined1  [16])0x0;
      do {
        uVar7 = *(undefined4 *)((long)puVar31 + lVar50);
        uVar62 = (ulong)(ushort)uVar7 & 0xffffffffffff00ff;
        auVar18._8_4_ = 0;
        auVar18._0_8_ = uVar62;
        auVar18[0xc] = (char)((uint)uVar7 >> 0x18);
        auVar19[8] = (char)((uint)uVar7 >> 0x10);
        auVar19._0_8_ = uVar62;
        auVar19[9] = 0;
        auVar19._10_3_ = auVar18._10_3_;
        auVar22._5_8_ = 0;
        auVar22._0_5_ = auVar19._8_5_;
        auVar71._0_4_ = (undefined4)uVar62;
        auVar20[4] = (char)((uint)uVar7 >> 8);
        auVar20._0_4_ = auVar71._0_4_;
        auVar20[5] = 0;
        auVar20._6_7_ = SUB137(auVar22 << 0x40,6);
        auVar71._4_9_ = auVar20._4_9_;
        auVar71._13_3_ = 0;
        auVar70 = auVar70 | auVar71;
        lVar50 = lVar50 + 4;
      } while (lVar50 != 8);
      auVar68._0_8_ = auVar70._8_8_;
      auVar68._8_4_ = auVar70._8_4_;
      auVar68._12_4_ = auVar70._12_4_;
      uVar44 = (SUB164(auVar67 | auVar69,4) | SUB164(auVar67 | auVar69,0)) & 7;
      if (3 < uVar44) {
        uVar44 = 4;
      }
      uVar48 = (SUB164(auVar68 | auVar70,4) | SUB164(auVar68 | auVar70,0)) & 7;
      uVar62 = (ulong)uVar48;
      if (3 < uVar48) {
        uVar62 = 4;
      }
      uVar62 = (ulong)(byte)get_txb_ctx_general_skip_contexts[uVar62 + (ulong)uVar44 * 5];
      goto LAB_0017ee77;
    }
    lVar50 = ((ulong)(uVar62 - 10 < 6) * 3 + 1) - (ulong)(*(long *)puVar46 == 0);
    bVar65 = *(long *)puVar31 == 0;
LAB_0017eac1:
    uVar62 = (lVar50 - (ulong)bVar65) + 8;
    goto LAB_0017ee77;
  default:
    uVar44 = *(uint *)((long)tx_size_wide_unit + (ulong)((uint)tx_size * 4));
    uVar52 = 1;
    if (1 < (int)uVar44) {
      uVar52 = (ulong)uVar44;
    }
    uVar44 = *(uint *)((long)tx_size_high_unit + (ulong)((uint)tx_size * 4));
    uVar54 = 0;
    uVar42 = 0;
    do {
      uVar42 = (ulong)(uint)((int)uVar42 +
                            (int)*(char *)((long)&get_txb_ctx_general_signs +
                                          (ulong)(*(byte *)((long)puVar46 + uVar54) >> 3)));
      uVar54 = uVar54 + 1;
    } while (uVar52 != uVar54);
    uVar54 = 1;
    if (1 < (int)uVar44) {
      uVar54 = (ulong)uVar44;
    }
    uVar58 = 0;
    do {
      uVar42 = (long)(int)uVar42 +
               (long)*(char *)((long)&get_txb_ctx_general_signs +
                              (ulong)(*(byte *)((long)puVar31 + uVar58) >> 3));
      uVar58 = uVar58 + 1;
    } while (uVar54 != uVar58);
    cStack_659 = get_txb_ctx_general_dc_sign_contexts[uVar42 + 0x20];
    if (plane == 0) {
      uVar62 = 0;
      if (txsize_to_bsize[uVar56] != plane_bsize) {
        uVar42 = 0;
        do {
          uVar44 = (uint)uVar62 | (uint)*(byte *)((long)puVar46 + uVar42);
          uVar62 = (ulong)uVar44;
          uVar42 = uVar42 + 1;
        } while (uVar52 != uVar42);
        uVar62 = 0;
        uVar48 = 0;
        do {
          uVar48 = uVar48 | *(byte *)((long)puVar31 + uVar62);
          uVar62 = uVar62 + 1;
        } while (uVar54 != uVar62);
        uVar44 = uVar44 & 7;
        if (3 < uVar44) {
          uVar44 = 4;
        }
        uVar64 = uVar48 & 7;
        if (3 < (uVar48 & 7)) {
          uVar64 = 4;
        }
        uVar62 = (ulong)(byte)get_txb_ctx_general_skip_contexts[(ulong)uVar64 + (ulong)uVar44 * 5];
      }
      goto LAB_0017ee77;
    }
  }
  switch(uVar56) {
  case 0:
    bVar65 = (byte)*puVar46 == 0;
    goto LAB_0017ee1b;
  case 1:
    bVar65 = (short)*puVar46 == 0;
    goto LAB_0017ee3e;
  case 2:
    bVar65 = *puVar46 == 0;
    break;
  case 3:
    bVar65 = *(long *)puVar46 == 0;
    goto LAB_0017ede3;
  case 4:
    bVar65 = *(long *)(puVar46 + 2) == 0 && *(long *)puVar46 == 0;
    goto LAB_0017edfe;
  case 5:
    bVar65 = (byte)*puVar46 == 0;
    goto LAB_0017ee3e;
  case 6:
    bVar65 = (short)*puVar46 == 0;
    goto LAB_0017ee1b;
  case 7:
    bVar65 = (short)*puVar46 == 0;
    break;
  case 8:
    bVar65 = *puVar46 == 0;
    goto LAB_0017ee3e;
  case 9:
    bVar65 = *puVar46 == 0;
    goto LAB_0017ede3;
  case 10:
    bVar65 = *(long *)puVar46 == 0;
    break;
  case 0xb:
    bVar65 = *(long *)puVar46 == 0;
    goto LAB_0017edfe;
  case 0xc:
    bVar65 = *(long *)(puVar46 + 2) == 0 && *(long *)puVar46 == 0;
    goto LAB_0017ede3;
  case 0xd:
    bVar65 = (byte)*puVar46 == 0;
    break;
  case 0xe:
    bVar65 = *puVar46 == 0;
LAB_0017ee1b:
    bVar65 = !bVar65;
    bVar66 = (byte)*puVar31 == 0;
    goto LAB_0017ee45;
  case 0xf:
    bVar65 = (short)*puVar46 == 0;
LAB_0017ede3:
    bVar65 = !bVar65;
    bVar66 = *(long *)puVar31 == 0;
    goto LAB_0017ee45;
  case 0x10:
    bVar65 = *(long *)puVar46 == 0;
LAB_0017ee3e:
    bVar65 = !bVar65;
    bVar66 = (short)*puVar31 == 0;
    goto LAB_0017ee45;
  case 0x11:
    bVar65 = *puVar46 == 0;
LAB_0017edfe:
    bVar65 = !bVar65;
    bVar66 = *(long *)(puVar31 + 2) == 0 && *(long *)puVar31 == 0;
    goto LAB_0017ee45;
  case 0x12:
    bVar65 = *(long *)(puVar46 + 2) == 0 && *(long *)puVar46 == 0;
    break;
  default:
    bVar65 = false;
    bVar66 = false;
    goto LAB_0017ee48;
  }
  bVar65 = !bVar65;
  bVar66 = *puVar31 == 0;
LAB_0017ee45:
  bVar66 = !bVar66;
LAB_0017ee48:
  uVar62 = (ulong)("\x04\x05\x05\x06\a\a\b\t\t\n\v\v\f\r\r\x0e\x06\x06\b\b\n\n"
                   [txsize_to_bsize[uVar56]] <
                  "\x04\x05\x05\x06\a\a\b\t\t\n\v\v\f\r\r\x0e\x06\x06\b\b\n\n"[uVar62]) * 3 +
           (ulong)bVar66 + (ulong)bVar65 + 7;
LAB_0017ee77:
  iVar24 = 1 << ((char)(dcb->xd).bd + 7U & 0x1f);
  pFVar9 = (dcb->xd).tile_ctx;
  uVar44 = (uint)""[uVar56] + (uint)""[uVar56] + 1 >> 1;
  uVar2 = *(ushort *)&pMVar8->field_0xa7;
  uVar3 = dcb->cb_offset[plane];
  ptVar10 = dcb->dqcoeff_block[plane];
  iVar25 = av1_get_tx_scale(tx_size);
  uVar48 = (uint)tx_size;
  if (tx_size < 0x11) {
    uVar52 = 3;
    if ((1 < uVar48 - 0xb) && (uVar48 != 4)) {
LAB_0017ef38:
      uVar52 = uVar56;
    }
  }
  else if (uVar48 == 0x11) {
    uVar52 = 9;
  }
  else {
    if (uVar48 != 0x12) goto LAB_0017ef38;
    uVar52 = 10;
  }
  uVar57 = uVar44 & 0xff;
  uVar64 = (uint)tx_size;
  if (tx_size < 0x11) {
    uVar42 = 3;
    if ((1 < uVar64 - 0xb) && (uVar48 != 4)) {
LAB_0017ef7d:
      uVar42 = uVar56;
    }
  }
  else if (uVar64 == 0x11) {
    uVar42 = 9;
  }
  else {
    if (uVar48 != 0x12) goto LAB_0017ef7d;
    uVar42 = 10;
  }
  if (tx_size < 0x11) {
    uVar54 = 3;
    if ((1 < uVar64 - 0xb) && (uVar64 != 4)) {
LAB_0017efc5:
      uVar54 = uVar56;
    }
  }
  else if (uVar64 == 0x11) {
    uVar54 = 9;
  }
  else {
    if (uVar64 != 0x12) goto LAB_0017efc5;
    uVar54 = 10;
  }
  uVar48 = tx_size_high_log2[uVar52];
  iVar30 = tx_size_wide[uVar42];
  iVar60 = tx_size_high[uVar54];
  paaVar49 = pFVar9->txb_skip_cdf[uVar57] + uVar62;
  dec = &r->ec;
  iVar26 = od_ec_decode_cdf_q15(dec,*paaVar49,2);
  if (r->allow_update_cdf != '\0') {
    uVar4 = (*paaVar49)[2];
    bVar34 = (char)(uVar4 >> 4) + 4;
    uVar23 = (*paaVar49)[0];
    if ((char)iVar26 < '\x01') {
      sVar6 = -(uVar23 >> (bVar34 & 0x1f));
    }
    else {
      sVar6 = (short)((int)(0x8000 - (uint)uVar23) >> (bVar34 & 0x1f));
    }
    (*paaVar49)[0] = sVar6 + uVar23;
    (*paaVar49)[2] = uVar4 + (uVar4 < 0x20);
  }
  peVar11 = dcb->eob_data[plane];
  uVar4 = dcb->txb_offset[plane];
  peVar11[uVar4].eob = 0;
  peVar11[uVar4].max_scan_line = 0;
  if (iVar26 != 0) {
    peVar11[uVar4].max_scan_line = 0;
    uVar44 = 0;
    if (plane == 0) {
      (dcb->xd).tx_type_map[(dcb->xd).tx_type_map_stride * row + col] = '\0';
      uVar44 = 0;
    }
    goto LAB_001800f6;
  }
  if (plane == 0) {
    av1_read_tx_type(cm,&dcb->xd,row,col,tx_size,r);
  }
  pMVar12 = *(dcb->xd).mi;
  if (((dcb->xd).lossless[*(ushort *)&pMVar12->field_0xa7 & 7] == 0) &&
     ((0x61810UL >> (uVar56 & 0x3f) & 1) == 0)) {
    if (plane == 0) {
      bVar34 = (dcb->xd).tx_type_map[(dcb->xd).tx_type_map_stride * row + col];
    }
    else {
      cVar47 = (char)*(ushort *)&pMVar12->field_0xa7;
      if ((cVar47 < '\0') || ('\0' < pMVar12->ref_frame[0])) {
        pbVar33 = (dcb->xd).tx_type_map +
                  ((row << ((byte)(dcb->xd).plane[1].subsampling_y & 0x1f)) *
                   (dcb->xd).tx_type_map_stride +
                  (col << ((byte)(dcb->xd).plane[1].subsampling_x & 0x1f)));
      }
      else {
        pbVar33 = intra_mode_to_tx_type__intra_mode_to_tx_type +
                  (byte)get_uv_mode_uv2y[pMVar12->uv_mode];
      }
      uVar64 = 1;
      if (-1 < cVar47) {
        uVar64 = (uint)('\0' < pMVar12->ref_frame[0]);
      }
      if ((0x18608UL >> (uVar56 & 0x3f) & 1) == 0) {
        if ((cm->features).reduced_tx_set_used == false) {
          uVar64 = (uint)av1_ext_tx_set_lookup[0]
                         [(ulong)((0x60604UL >> (uVar56 & 0x3f) & 1) != 0) + (ulong)(uVar64 * 2)];
        }
        else {
          uVar64 = (uint)(byte)((uVar64 == 0) + 1);
        }
      }
      uVar64 = *(uint *)((long)av1_ext_tx_used[0] + (ulong)*pbVar33 * 4 + (ulong)(uVar64 << 6));
      if (uVar64 != 0) {
        uVar64 = (uint)*pbVar33;
      }
      bVar34 = (byte)uVar64;
    }
  }
  else {
    bVar34 = 0;
  }
  bVar66 = plane != 0;
  uVar42 = (ulong)bVar66;
  uVar52 = (ulong)bVar34;
  tx_class = ""[uVar52];
  pqVar32 = av1_get_iqmatrix(&cm->quant_params,&dcb->xd,plane,tx_size,bVar34);
  piVar13 = av1_scan_orders[tx_size][bVar34].scan;
  bVar65 = 9 < bVar34;
  uVar62 = (ulong)bVar65;
  switch(""[uVar56]) {
  case '\0':
    icdf = pFVar9->eob_flag_cdf16[uVar42] + uVar62;
    iVar26 = od_ec_decode_cdf_q15(dec,*icdf,5);
    if (r->allow_update_cdf != '\0') {
      paVar43 = pFVar9->eob_flag_cdf16[uVar42][uVar62] + 5;
      uVar23 = pFVar9->eob_flag_cdf16[uVar42][uVar62][5];
      bVar35 = (char)(uVar23 >> 4) + 5;
      lVar50 = 0;
      do {
        uVar5 = (*icdf)[lVar50];
        if (lVar50 < (char)iVar26) {
          sVar6 = (short)((int)(0x8000 - (uint)uVar5) >> (bVar35 & 0x1f));
        }
        else {
          sVar6 = -(uVar5 >> (bVar35 & 0x1f));
        }
        (*icdf)[lVar50] = sVar6 + uVar5;
        lVar50 = lVar50 + 1;
      } while (lVar50 != 4);
LAB_0017f660:
      *paVar43 = *paVar43 + (ushort)(uVar23 < 0x20);
    }
    break;
  case '\x01':
    lVar50 = (ulong)bVar65 * 0x10 + uVar62 * -2 + uVar42 * 0x1c;
    puVar63 = (uint16_t *)((long)pFVar9 + lVar50 + 0x3f6);
    iVar26 = od_ec_decode_cdf_q15(dec,puVar63,6);
    if (r->allow_update_cdf != '\0') {
      paVar43 = (aom_cdf_prob *)((long)pFVar9 + lVar50 + 0x402);
      uVar23 = *(ushort *)((long)pFVar9 + lVar50 + 0x402);
      bVar35 = (char)(uVar23 >> 4) + 5;
      lVar50 = 0;
      do {
        uVar5 = puVar63[lVar50];
        if (lVar50 < (char)iVar26) {
          sVar6 = (short)((int)(0x8000 - (uint)uVar5) >> (bVar35 & 0x1f));
        }
        else {
          sVar6 = -(uVar5 >> (bVar35 & 0x1f));
        }
        puVar63[lVar50] = sVar6 + uVar5;
        lVar50 = lVar50 + 1;
      } while (lVar50 != 5);
      goto LAB_0017f660;
    }
    break;
  case '\x02':
    icdf_01 = pFVar9->eob_flag_cdf64[bVar66] + bVar65;
    iVar26 = od_ec_decode_cdf_q15(dec,*icdf_01,7);
    if (r->allow_update_cdf != '\0') {
      paVar43 = pFVar9->eob_flag_cdf64[bVar66][bVar65] + 7;
      uVar23 = pFVar9->eob_flag_cdf64[bVar66][bVar65][7];
      bVar35 = (char)(uVar23 >> 4) + 5;
      lVar50 = 0;
      do {
        uVar5 = (*icdf_01)[lVar50];
        if (lVar50 < (char)iVar26) {
          sVar6 = (short)((int)(0x8000 - (uint)uVar5) >> (bVar35 & 0x1f));
        }
        else {
          sVar6 = -(uVar5 >> (bVar35 & 0x1f));
        }
        (*icdf_01)[lVar50] = sVar6 + uVar5;
        lVar50 = lVar50 + 1;
      } while (lVar50 != 6);
      goto LAB_0017f660;
    }
    break;
  case '\x03':
    icdf_02 = pFVar9->eob_flag_cdf128[uVar42] + uVar62;
    iVar26 = od_ec_decode_cdf_q15(dec,*icdf_02,8);
    if (r->allow_update_cdf != '\0') {
      paVar43 = pFVar9->eob_flag_cdf128[uVar42][uVar62] + 8;
      uVar23 = pFVar9->eob_flag_cdf128[uVar42][uVar62][8];
      bVar35 = (char)(uVar23 >> 4) + 5;
      lVar50 = 0;
      do {
        uVar5 = (*icdf_02)[lVar50];
        if (lVar50 < (char)iVar26) {
          sVar6 = (short)((int)(0x8000 - (uint)uVar5) >> (bVar35 & 0x1f));
        }
        else {
          sVar6 = -(uVar5 >> (bVar35 & 0x1f));
        }
        (*icdf_02)[lVar50] = sVar6 + uVar5;
        lVar50 = lVar50 + 1;
      } while (lVar50 != 7);
      goto LAB_0017f660;
    }
    break;
  case '\x04':
    icdf_00 = pFVar9->eob_flag_cdf256[uVar42] + uVar62;
    iVar26 = od_ec_decode_cdf_q15(dec,*icdf_00,9);
    if (r->allow_update_cdf != '\0') {
      paVar43 = pFVar9->eob_flag_cdf256[uVar42][uVar62] + 9;
      uVar23 = pFVar9->eob_flag_cdf256[uVar42][uVar62][9];
      bVar35 = (char)(uVar23 >> 4) + 5;
      lVar50 = 0;
      do {
        uVar5 = (*icdf_00)[lVar50];
        if (lVar50 < (char)iVar26) {
          sVar6 = (short)((int)(0x8000 - (uint)uVar5) >> (bVar35 & 0x1f));
        }
        else {
          sVar6 = -(uVar5 >> (bVar35 & 0x1f));
        }
        (*icdf_00)[lVar50] = sVar6 + uVar5;
        lVar50 = lVar50 + 1;
      } while (lVar50 != 8);
      goto LAB_0017f660;
    }
    break;
  case '\x05':
    icdf_03 = pFVar9->eob_flag_cdf512[uVar42] + uVar62;
    iVar26 = od_ec_decode_cdf_q15(dec,*icdf_03,10);
    if (r->allow_update_cdf != '\0') {
      paVar43 = pFVar9->eob_flag_cdf512[uVar42][uVar62] + 10;
      uVar23 = pFVar9->eob_flag_cdf512[uVar42][uVar62][10];
      bVar35 = (char)(uVar23 >> 4) + 5;
      lVar50 = 0;
      do {
        uVar5 = (*icdf_03)[lVar50];
        if (lVar50 < (char)iVar26) {
          sVar6 = (short)((int)(0x8000 - (uint)uVar5) >> (bVar35 & 0x1f));
        }
        else {
          sVar6 = -(uVar5 >> (bVar35 & 0x1f));
        }
        (*icdf_03)[lVar50] = sVar6 + uVar5;
        lVar50 = lVar50 + 1;
      } while (lVar50 != 9);
      goto LAB_0017f660;
    }
    break;
  default:
    uVar42 = (ulong)((uint)bVar66 * 0x30);
    puVar63 = (uint16_t *)((long)pFVar9->eob_flag_cdf1024[0][uVar62] + uVar42);
    iVar26 = od_ec_decode_cdf_q15(dec,puVar63,0xb);
    if (r->allow_update_cdf != '\0') {
      paVar43 = (aom_cdf_prob *)((long)pFVar9->eob_flag_cdf1024[0][uVar62] + uVar42 + 0x16);
      uVar23 = *(ushort *)((long)pFVar9->eob_flag_cdf1024[0][uVar62] + uVar42 + 0x16);
      bVar35 = (char)(uVar23 >> 4) + 5;
      lVar50 = 0;
      do {
        uVar5 = puVar63[lVar50];
        if (lVar50 < (char)iVar26) {
          sVar6 = (short)((int)(0x8000 - (uint)uVar5) >> (bVar35 & 0x1f));
        }
        else {
          sVar6 = -(uVar5 >> (bVar35 & 0x1f));
        }
        puVar63[lVar50] = sVar6 + uVar5;
        lVar50 = lVar50 + 1;
      } while (lVar50 != 10);
      goto LAB_0017f660;
    }
  }
  sVar6 = av1_eob_offset_bits[(long)iVar26 + 1];
  iVar61 = (int)sVar6;
  iVar27 = 0;
  if (0 < sVar6) {
    bVar65 = plane != 0;
    iVar27 = iVar26 + -2;
    paaVar49 = pFVar9->eob_extra_cdf[uVar57][bVar65] + iVar27;
    iVar28 = od_ec_decode_cdf_q15(dec,*paaVar49,2);
    if (r->allow_update_cdf != '\0') {
      uVar23 = pFVar9->eob_extra_cdf[uVar57][bVar65][iVar27][2];
      bVar35 = (char)(uVar23 >> 4) + 4;
      uVar5 = (*paaVar49)[0];
      if ((char)iVar28 < '\x01') {
        sVar14 = -(uVar5 >> (bVar35 & 0x1f));
      }
      else {
        sVar14 = (short)((int)(0x8000 - (uint)uVar5) >> (bVar35 & 0x1f));
      }
      (*paaVar49)[0] = sVar14 + uVar5;
      pFVar9->eob_extra_cdf[uVar57][bVar65][iVar27][2] = uVar23 + (uVar23 < 0x20);
    }
    iVar27 = 1 << ((char)sVar6 - 1U & 0x1f);
    if (iVar28 == 0) {
      iVar27 = 0;
    }
    if (sVar6 != 1) {
      iVar28 = 2;
      if (2 < iVar61) {
        iVar28 = iVar61;
      }
      iVar28 = iVar28 + -1;
      iVar61 = iVar61 + -2;
      do {
        iVar29 = od_ec_decode_bool_q15(dec,0x4000);
        iVar41 = 1 << ((byte)iVar61 & 0x1f);
        if (iVar29 == 0) {
          iVar41 = 0;
        }
        iVar27 = iVar27 + iVar41;
        iVar61 = iVar61 + -1;
        iVar28 = iVar28 + -1;
      } while (iVar28 != 0);
    }
  }
  iVar61 = 0;
  if (2 < av1_eob_group_start[(long)iVar26 + 1]) {
    iVar61 = iVar27;
  }
  uVar64 = iVar61 + (uint)(ushort)av1_eob_group_start[(long)iVar26 + 1];
  peVar11[uVar4].eob = (uint16_t)uVar64;
  if ((uVar64 & 0xfffe) != 0) {
    memset(abStack_558,0,((long)iVar30 + 4) * ((long)iVar60 + 4) + 0x10);
  }
  uVar64 = uVar64 & 0xffff;
  bVar35 = (byte)uVar48;
  if (uVar64 == 1) {
    uVar62 = 0;
  }
  else {
    bVar36 = bVar35 & 0x1f;
    iVar26 = iVar30 << bVar36;
    iVar60 = iVar26 + 7;
    if (-1 < iVar30 << bVar36) {
      iVar60 = iVar26;
    }
    uVar62 = 1;
    if (iVar60 >> 3 < (int)(uVar64 - 1)) {
      iVar60 = iVar26 + 3;
      if (-1 < iVar30 << bVar36) {
        iVar60 = iVar26;
      }
      uVar62 = (ulong)(iVar60 >> 2 < (int)(uVar64 - 1)) | 2;
    }
  }
  sVar6 = piVar13[(ulong)uVar64 - 1];
  iVar60 = (int)sVar6;
  bVar65 = plane != 0;
  uVar42 = (ulong)(uVar57 << 6);
  puVar63 = (uint16_t *)((long)pFVar9->coeff_base_eob_cdf[0][bVar65][uVar62] + uVar42);
  br_cdf = (br_cdf_arr)0x17f88a;
  iVar30 = od_ec_decode_cdf_q15(dec,puVar63,3);
  if (r->allow_update_cdf != '\0') {
    uVar23 = *(ushort *)((long)pFVar9->coeff_base_eob_cdf[0][bVar65][uVar62] + uVar42 + 6);
    bVar36 = (char)(uVar23 >> 4) + 4;
    lVar50 = 0;
    do {
      uVar5 = puVar63[lVar50];
      if (lVar50 < (char)iVar30) {
        sVar14 = (short)((int)(0x8000 - (uint)uVar5) >> (bVar36 & 0x1f));
      }
      else {
        sVar14 = -(uVar5 >> (bVar36 & 0x1f));
      }
      puVar63[lVar50] = sVar14 + uVar5;
      lVar50 = lVar50 + 1;
    } while (lVar50 != 2);
    psVar1 = (short *)((long)pFVar9->coeff_base_eob_cdf[0][bVar65][uVar62] + uVar42 + 6);
    *psVar1 = *psVar1 + (ushort)(uVar23 < 0x20);
  }
  iVar26 = iVar30 + 1;
  bVar36 = (byte)iVar26;
  bVar40 = (byte)uVar44;
  if (1 < iVar30) {
    iVar27 = iVar60 >> (bVar35 & 0x1f);
    iVar30 = iVar27 << (bVar35 & 0x1f);
    if (sVar6 == 0) {
      lVar50 = 0;
    }
    else {
      lVar50 = 7;
      if ((((9 < bVar34) || (1 < iVar60 - iVar30)) || (1 < iVar27)) &&
         (((0xa800UL >> (uVar52 & 0x3f) & 1) == 0 || (iVar27 != 0)))) {
        if (iVar60 != iVar30) {
          lVar50 = 0xe;
        }
        if ((0x5400UL >> (uVar52 & 0x3f) & 1) == 0) {
          lVar50 = 0xe;
        }
      }
    }
    bVar37 = 3;
    if (bVar40 < 3) {
      bVar37 = bVar40;
    }
    paaVar39 = pFVar9->coeff_br_cdf[bVar37][bVar65] + lVar50;
    uVar44 = 0;
    do {
      br_cdf = (br_cdf_arr)0x17f9aa;
      iVar30 = od_ec_decode_cdf_q15(dec,*paaVar39,4);
      if (r->allow_update_cdf != '\0') {
        uVar23 = pFVar9->coeff_br_cdf[bVar37][bVar65][lVar50][4];
        bVar36 = (char)(uVar23 >> 4) + 5;
        lVar53 = 0;
        do {
          uVar5 = (*paaVar39)[lVar53];
          if (lVar53 < (char)iVar30) {
            sVar6 = (short)((int)(0x8000 - (uint)uVar5) >> (bVar36 & 0x1f));
          }
          else {
            sVar6 = -(uVar5 >> (bVar36 & 0x1f));
          }
          (*paaVar39)[lVar53] = sVar6 + uVar5;
          lVar53 = lVar53 + 1;
        } while (lVar53 != 3);
        paVar43 = pFVar9->coeff_br_cdf[bVar37][bVar65][lVar50] + 4;
        *paVar43 = *paVar43 + (ushort)(uVar23 < 0x20);
      }
      iVar26 = iVar26 + iVar30;
      bVar36 = (byte)iVar26;
    } while ((2 < iVar30) && (bVar66 = uVar44 < 9, uVar44 = uVar44 + 3, bVar66));
  }
  abStack_558[iVar60 + (iVar60 >> (bVar35 & 0x1f)) * 4] = bVar36;
  uVar23 = peVar11[uVar4].eob;
  if (1 < uVar23) {
    bVar36 = 3;
    if (bVar40 < 3) {
      bVar36 = bVar40;
    }
    levels = pFVar9->coeff_base_cdf[uVar57] + bVar65;
    if (bVar34 < 10) {
      if (uVar23 == 2) {
        iVar30 = 0;
      }
      else {
        iVar30 = 1 << (bVar35 & 0x1f);
        iVar60 = iVar30 + 4;
        uVar62 = (ulong)(uVar23 - 2);
        do {
          sVar6 = piVar13[uVar62];
          uVar44 = (int)sVar6 >> (bVar35 & 0x1f);
          lVar50 = (long)(int)((int)sVar6 + uVar44 * 4);
          pbVar33 = abStack_558 + lVar50;
          bVar34 = pbVar33[(long)iVar30 + 4];
          if (2 < pbVar33[(long)iVar30 + 4]) {
            bVar34 = 3;
          }
          bVar40 = abStack_558[lVar50 + 1];
          if (2 < bVar40) {
            bVar40 = 3;
          }
          bVar37 = pbVar33[(long)iVar30 + 5];
          if (2 < bVar37) {
            bVar37 = 3;
          }
          bVar51 = pbVar33[(long)(2 << (bVar35 & 0x1f)) + 8];
          if (2 < bVar51) {
            bVar51 = 3;
          }
          bVar38 = abStack_558[lVar50 + 2];
          if (2 < bVar38) {
            bVar38 = 3;
          }
          bVar34 = (byte)(bVar51 + bVar37 + bVar40 + bVar34 + bVar38 + 1) >> 1;
          if (3 < bVar34) {
            bVar34 = 4;
          }
          paaVar39 = *levels + (ulong)bVar34 + (long)av1_nz_map_ctx_offset[uVar56][sVar6];
          br_cdf = (br_cdf_arr)0x17fbf2;
          iVar26 = od_ec_decode_cdf_q15(dec,*paaVar39,4);
          if (r->allow_update_cdf != '\0') {
            uVar23 = (*paaVar39)[4];
            bVar34 = (char)(uVar23 >> 4) + 5;
            lVar50 = 0;
            do {
              uVar5 = (*paaVar39)[lVar50];
              if (lVar50 < (char)iVar26) {
                sVar14 = (short)((int)(0x8000 - (uint)uVar5) >> (bVar34 & 0x1f));
              }
              else {
                sVar14 = -(uVar5 >> (bVar34 & 0x1f));
              }
              (*paaVar39)[lVar50] = sVar14 + uVar5;
              lVar50 = lVar50 + 1;
            } while (lVar50 != 3);
            (*paaVar39)[4] = (*paaVar39)[4] + (ushort)(uVar23 < 0x20);
          }
          if (2 < iVar26) {
            uVar64 = (int)sVar6 - (uVar44 << (bVar35 & 0x1f));
            iVar27 = uVar44 * iVar60 + uVar64;
            bVar34 = abStack_558[(long)iVar27 + 1];
            if (0xe < abStack_558[(long)iVar27 + 1]) {
              bVar34 = 0xf;
            }
            bVar40 = abStack_558[iVar27 + iVar60];
            if (0xe < bVar40) {
              bVar40 = 0xf;
            }
            bVar37 = abStack_558[iVar27 + 1 + iVar60];
            if (0xe < bVar37) {
              bVar37 = 0xf;
            }
            bVar34 = (byte)(bVar40 + bVar34 + bVar37 + 1) >> 1;
            if (5 < bVar34) {
              bVar34 = 6;
            }
            paaVar39 = pFVar9->coeff_br_cdf[bVar36][bVar65] + 0xe;
            if ((int)(uVar64 | uVar44) < 2) {
              paaVar39 = pFVar9->coeff_br_cdf[bVar36][bVar65] + 7;
            }
            paaVar39 = paaVar39 + bVar34;
            uVar44 = 0;
            do {
              br_cdf = (br_cdf_arr)0x17fd02;
              iVar27 = od_ec_decode_cdf_q15(dec,*paaVar39,4);
              if (r->allow_update_cdf != '\0') {
                uVar23 = (*paaVar39)[4];
                bVar34 = (char)(uVar23 >> 4) + 5;
                lVar50 = 0;
                do {
                  uVar5 = (*paaVar39)[lVar50];
                  if (lVar50 < (char)iVar27) {
                    sVar6 = (short)((int)(0x8000 - (uint)uVar5) >> (bVar34 & 0x1f));
                  }
                  else {
                    sVar6 = -(uVar5 >> (bVar34 & 0x1f));
                  }
                  (*paaVar39)[lVar50] = sVar6 + uVar5;
                  lVar50 = lVar50 + 1;
                } while (lVar50 != 3);
                (*paaVar39)[4] = (*paaVar39)[4] + (ushort)(uVar23 < 0x20);
              }
              iVar26 = iVar26 + iVar27;
            } while ((2 < iVar27) && (bVar66 = uVar44 < 9, uVar44 = uVar44 + 3, bVar66));
          }
          *pbVar33 = (byte)iVar26;
          bVar66 = 1 < (long)uVar62;
          uVar62 = uVar62 - 1;
        } while (bVar66);
        iVar30 = 0;
      }
    }
    else {
      iVar30 = uVar23 - 2;
    }
    read_coeffs_reverse(r,tx_size,tx_class,iVar30,(int)piVar13,(int16_t *)(ulong)uVar48,
                        (int)abStack_558,(uint8_t *)levels,pFVar9->coeff_br_cdf[bVar36][bVar65],
                        br_cdf);
  }
  if (peVar11[uVar4].eob == 0) {
    iVar24 = 0;
    uVar44 = 0;
  }
  else {
    uVar48 = iVar24 - 1;
    uVar64 = -iVar24;
    lVar50 = (long)cStack_659;
    paaVar49 = pFVar9->dc_sign_cdf[bVar65] + lVar50;
    uVar62 = 0;
    uVar44 = 0;
    iVar24 = 0;
    do {
      iVar30 = (int)piVar13[uVar62];
      bVar34 = abStack_558[iVar30 + (iVar30 >> (bVar35 & 0x1f)) * 4];
      uVar57 = (uint)bVar34;
      if (bVar34 != 0) {
        uVar23 = peVar11[uVar4].max_scan_line;
        if ((int)(uint)peVar11[uVar4].max_scan_line <= iVar30) {
          uVar23 = piVar13[uVar62];
        }
        peVar11[uVar4].max_scan_line = uVar23;
        if (uVar62 == 0) {
          iVar60 = od_ec_decode_cdf_q15(dec,*paaVar49,2);
          cVar47 = (char)iVar60;
          if (r->allow_update_cdf != '\0') {
            uVar23 = pFVar9->dc_sign_cdf[bVar65][lVar50][2];
            bVar36 = (char)(uVar23 >> 4) + 4;
            uVar5 = (*paaVar49)[0];
            if (cVar47 < '\x01') {
              sVar6 = -(uVar5 >> (bVar36 & 0x1f));
            }
            else {
              sVar6 = (short)((int)(0x8000 - (uint)uVar5) >> (bVar36 & 0x1f));
            }
            (*paaVar49)[0] = sVar6 + uVar5;
            pFVar9->dc_sign_cdf[bVar65][lVar50][2] = uVar23 + (uVar23 < 0x20);
          }
        }
        else {
          iVar60 = od_ec_decode_bool_q15(dec,0x4000);
          cVar47 = (char)iVar60;
        }
        if (0xe < bVar34) {
          uVar57 = 0;
          iVar60 = 0;
          do {
            if (iVar60 != 0) goto LAB_0017ff9c;
            iVar60 = od_ec_decode_bool_q15(dec,0x4000);
            uVar57 = uVar57 + 1;
          } while (uVar57 != 0x15);
          aom_internal_error((dcb->xd).error_info,AOM_CODEC_CORRUPT_FRAME,
                             "Invalid length in read_golomb");
          uVar57 = 0x15;
LAB_0017ff9c:
          iVar60 = 0;
          if (1 < uVar57) {
            iVar26 = uVar57 - 1;
            iVar60 = 1;
            do {
              iVar27 = od_ec_decode_bool_q15(dec,0x4000);
              iVar60 = iVar27 + iVar60 * 2;
              iVar26 = iVar26 + -1;
            } while (iVar26 != 0);
            iVar60 = iVar60 + -1;
          }
          uVar57 = (uint)bVar34 + iVar60;
        }
        uVar45 = -uVar57;
        if (cVar47 == '\0') {
          uVar45 = uVar57;
        }
        if (uVar62 == 0) {
          uVar44 = uVar45;
        }
        iVar60 = (int)(dcb->xd).plane[plane].seg_dequant_QTX[uVar2 & 7][(long)piVar13[uVar62] != 0];
        if (pqVar32 != (qm_val_t *)0x0) {
          iVar60 = (int)((uint)pqVar32[piVar13[uVar62]] * iVar60 + 0x10) >> 5;
        }
        iVar24 = iVar24 + (uVar57 & 0xfffff);
        uVar45 = ((uVar57 & 0xfffff) * iVar60 & 0xffffff) >> ((byte)iVar25 & 0x1f);
        uVar57 = -uVar45;
        if (cVar47 == '\0') {
          uVar57 = uVar45;
        }
        uVar45 = uVar48;
        if ((int)uVar57 < (int)uVar48) {
          uVar45 = uVar57;
        }
        if ((int)uVar57 < (int)uVar64) {
          uVar45 = uVar64;
        }
        ptVar10[(ulong)uVar3 + (long)iVar30] = uVar45;
      }
      uVar62 = uVar62 + 1;
    } while (uVar62 < peVar11[uVar4].eob);
  }
  iVar25 = 7;
  if (iVar24 < 7) {
    iVar25 = iVar24;
  }
  bVar35 = (byte)iVar25;
  bVar34 = bVar35 + 0x10;
  if (uVar44 == 0) {
    bVar34 = bVar35;
  }
  if ((int)uVar44 < 0) {
    bVar34 = bVar35 | 8;
  }
  uVar44 = (uint)bVar34;
LAB_001800f6:
  av1_set_entropy_contexts
            (&dcb->xd,(dcb->xd).plane + plane,plane,plane_bsize,tx_size,uVar44,col,row);
  if (((pMVar8->field_0xa7 & 0x80) != 0) || ('\0' < pMVar8->ref_frame[0])) {
    pMVar8 = *(dcb->xd).mi;
    if (((dcb->xd).lossless[*(ushort *)&pMVar8->field_0xa7 & 7] == 0) &&
       ((0x61810UL >> (uVar56 & 0x3f) & 1) == 0)) {
      if (plane == 0) {
        bVar34 = (dcb->xd).tx_type_map[row * (dcb->xd).tx_type_map_stride + col];
      }
      else {
        cVar47 = (char)*(ushort *)&pMVar8->field_0xa7;
        if ((cVar47 < '\0') || ('\0' < pMVar8->ref_frame[0])) {
          pbVar33 = (dcb->xd).tx_type_map +
                    ((row << ((byte)(dcb->xd).plane[plane != 0].subsampling_y & 0x1f)) *
                     (dcb->xd).tx_type_map_stride +
                    (col << ((byte)(dcb->xd).plane[plane != 0].subsampling_x & 0x1f)));
        }
        else {
          pbVar33 = intra_mode_to_tx_type__intra_mode_to_tx_type +
                    (byte)get_uv_mode_uv2y[pMVar8->uv_mode];
        }
        uVar44 = 1;
        if (-1 < cVar47) {
          uVar44 = (uint)('\0' < pMVar8->ref_frame[0]);
        }
        if ((0x18608UL >> (uVar56 & 0x3f) & 1) == 0) {
          if ((cm->features).reduced_tx_set_used == false) {
            uVar44 = (uint)av1_ext_tx_set_lookup[0]
                           [(ulong)((0x60604UL >> (uVar56 & 0x3f) & 1) != 0) + (ulong)(uVar44 * 2)];
          }
          else {
            uVar44 = (uint)(byte)((uVar44 == 0) + 1);
          }
        }
        iVar24 = *(int *)((long)av1_ext_tx_used[0] + (ulong)*pbVar33 * 4 + (ulong)(uVar44 << 6));
        bVar34 = (byte)iVar24;
        if (iVar24 != 0) {
          bVar34 = *pbVar33;
        }
      }
    }
    else {
      bVar34 = 0;
    }
    if (plane == 0) {
      iVar24 = *(int *)((long)tx_size_wide_unit + (ulong)((uint)tx_size * 4));
      iVar25 = *(int *)((long)tx_size_high_unit + (ulong)((uint)tx_size * 4));
      if (((0x41010UL >> (uVar56 & 0x3f) & 1) != 0) || ((0x20810UL >> (uVar56 & 0x3f) & 1) != 0)) {
        lVar50 = (long)(dcb->xd).tx_type_map_stride;
        lVar59 = row * lVar50 + (long)col;
        lVar53 = 0;
        do {
          lVar55 = 0;
          do {
            (dcb->xd).tx_type_map[lVar55 + lVar59] = bVar34;
            lVar55 = lVar55 + 4;
          } while (lVar55 < iVar24);
          lVar53 = lVar53 + 4;
          lVar59 = lVar59 + lVar50 * 4;
        } while (lVar53 < iVar25);
      }
    }
  }
  return;
}

Assistant:

static inline void read_coeffs_tx_intra_block(
    const AV1_COMMON *const cm, DecoderCodingBlock *dcb, aom_reader *const r,
    const int plane, const int row, const int col, const TX_SIZE tx_size) {
  MB_MODE_INFO *mbmi = dcb->xd.mi[0];
  if (!mbmi->skip_txfm) {
#if TXCOEFF_TIMER
    struct aom_usec_timer timer;
    aom_usec_timer_start(&timer);
#endif
    av1_read_coeffs_txb(cm, dcb, r, plane, row, col, tx_size);
#if TXCOEFF_TIMER
    aom_usec_timer_mark(&timer);
    const int64_t elapsed_time = aom_usec_timer_elapsed(&timer);
    cm->txcoeff_timer += elapsed_time;
    ++cm->txb_count;
#endif
  }
}